

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCase.h
# Opt level: O0

void SubtractionHelper<long,short,7>::
     SubtractThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (long *lhs,short *rhs,long *result)

{
  long lVar1;
  long *in_RDX;
  short *in_RSI;
  long *in_RDI;
  int64_t tmp;
  
  lVar1 = *in_RDI - (long)*in_RSI;
  if ((((*in_RDI < 0) || (-1 < *in_RSI)) || (*in_RDI <= lVar1)) &&
     ((*in_RSI < 0 || (lVar1 <= *in_RDI)))) {
    *in_RDX = lVar1;
    return;
  }
  safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
}

Assistant:

TestVector() : test_cases(nullptr), count(0), current(0) {}